

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Dam_ManCreatePairs(Dam_Man_t *p,int fVerbose)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Vec_Int_t *p_00;
  Hash_IntMan_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pObj;
  int *piVar11;
  Hash_IntMan_t *pHVar12;
  Vec_Flt_t *pVVar13;
  float *pfVar14;
  Vec_Que_t *pVVar15;
  Vec_Int_t *pVVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  double dVar23;
  int local_80;
  int local_60;
  int local_5c;
  Vec_Int_t *vRefsXor;
  Vec_Int_t *vRefsAnd;
  
  Dam_ManCollectSets(p);
  pVVar16 = p->pGia->vSuper;
  p_00 = Vec_IntAlloc(p->pGia->nObjs);
  p_01 = Hash_IntManStart(p->pGia->nObjs / 2);
  p_02 = Vec_IntStart(1000);
  Dam_ManCreateMultiRefs(p,&vRefsAnd,&vRefsXor);
  iVar18 = 0;
  uVar7 = 0;
  local_60 = 0;
  iVar6 = 0;
  local_5c = 0;
  while ((iVar18 < p->pGia->nObjs && (pObj = Gia_ManObj(p->pGia,iVar18), pObj != (Gia_Obj_t *)0x0)))
  {
    if (((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) &&
       (iVar1 = Dam_ObjHand(p,iVar18), iVar1 != 0)) {
      piVar11 = Dam_ObjSet(p,iVar18);
      iVar1 = *piVar11;
      pVVar16->nSize = 0;
      iVar2 = Gia_ObjIsXor(pObj);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsAndReal(p->pGia,pObj);
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                        ,0x280,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        for (lVar20 = 1; lVar20 <= *piVar11; lVar20 = lVar20 + 1) {
          iVar2 = Vec_IntEntry(vRefsAnd,piVar11[lVar20]);
          if (1 < iVar2) {
            Vec_IntPush(pVVar16,piVar11[lVar20]);
          }
        }
      }
      else {
        for (lVar20 = 1; lVar20 <= *piVar11; lVar20 = lVar20 + 1) {
          iVar2 = Abc_Lit2Var(piVar11[lVar20]);
          iVar2 = Vec_IntEntry(vRefsXor,iVar2);
          if (1 < iVar2) {
            Vec_IntPush(pVVar16,piVar11[lVar20]);
          }
        }
      }
      uVar7 = ((iVar1 + -1) * iVar1) / 2 + uVar7;
      iVar1 = pVVar16->nSize;
      if (1 < iVar1) {
        uVar17 = (uint)((iVar1 + -1) * iVar1) >> 1;
        uVar21 = (ulong)uVar17;
        Vec_IntPush(p_00,-iVar18);
        iVar1 = pVVar16->nSize;
        iVar2 = 0;
        while (iVar2 < iVar1) {
          iVar3 = Vec_IntEntry(pVVar16,iVar2);
          iVar2 = iVar2 + 1;
          for (iVar19 = iVar2; iVar1 = pVVar16->nSize, iVar19 < iVar1; iVar19 = iVar19 + 1) {
            iVar4 = Vec_IntEntry(pVVar16,iVar19);
            uVar5 = Gia_ObjIsXor(pObj);
            iVar1 = iVar3;
            if (uVar5 == iVar4 < iVar3) {
              iVar1 = iVar4;
              iVar4 = iVar3;
            }
            iVar1 = Hash_Int2ManInsert(p_01,iVar4,iVar1,(int)uVar21);
            iVar4 = Hash_Int2ObjInc(p_01,iVar1);
            if (iVar4 == 1) {
              iVar6 = iVar6 + 1;
              iVar4 = Gia_ObjIsXor(pObj);
              local_5c = local_5c + iVar4;
            }
            Vec_IntPush(p_00,iVar1);
            if (p_02->nSize <= iVar1) {
              uVar21 = 2;
              Vec_IntFillExtra(p_02,(p_02->nSize * 3) / 2,0);
            }
            iVar4 = Vec_IntEntry(p->vNodLevR,iVar18);
            Vec_IntUpdateEntry(p_02,iVar1,iVar4);
          }
        }
        local_60 = local_60 + uVar17;
      }
    }
    iVar18 = iVar18 + 1;
  }
  Vec_IntFree(vRefsAnd);
  Vec_IntFree(vRefsXor);
  pHVar12 = Hash_IntManStart((iVar6 * 3) / 2);
  p->vHash = pHVar12;
  iVar18 = iVar6 * 2;
  pVVar13 = (Vec_Flt_t *)malloc(0x10);
  iVar1 = iVar18;
  if (iVar6 * 2 - 1U < 0xf) {
    iVar1 = 0x10;
  }
  pVVar13->nSize = 0;
  pVVar13->nCap = iVar1;
  if (iVar1 == 0) {
    pfVar14 = (float *)0x0;
  }
  else {
    pfVar14 = (float *)malloc((long)iVar1 << 2);
  }
  pVVar13->pArray = pfVar14;
  p->vCounts = pVVar13;
  Vec_FltPush(pVVar13,1e+09);
  pVVar13 = p->vCounts;
  uVar17 = pVVar13->nCap;
  pVVar15 = (Vec_Que_t *)calloc(1,0x20);
  uVar21 = 0x10;
  if (0x10 < (int)uVar17) {
    uVar21 = (ulong)uVar17;
  }
  pVVar15->nSize = 1;
  pVVar15->nCap = (int)uVar21 + 1;
  __size = uVar21 * 4 + 4;
  piVar11 = (int *)malloc(__size);
  memset(piVar11,0xff,__size);
  pVVar15->pHeap = piVar11;
  piVar11 = (int *)malloc(__size);
  memset(piVar11,0xff,__size);
  pVVar15->pOrder = piVar11;
  p->vQue = pVVar15;
  pVVar15->pCostsFlt = &pVVar13->pArray;
  pVVar16 = Vec_IntAlloc(iVar18);
  p->vDiv2Nod = pVVar16;
  Vec_IntPush(pVVar16,1000000000);
  pVVar16 = Vec_IntAlloc(p->pGia->nObjs);
  p->vNodStore = pVVar16;
  Vec_IntPush(pVVar16,-1);
  uVar21 = 4;
  iVar1 = p_01->vObjs->nSize / 4;
  pVVar16 = Vec_IntAlloc(iVar1);
  pVVar16->nSize = iVar1;
  if (pVVar16->pArray != (int *)0x0) {
    memset(pVVar16->pArray,0xff,(long)iVar1 << 2);
  }
  uVar17 = iVar1 - 1;
  uVar22 = 0;
  iVar2 = 1;
  local_80 = -1;
  uVar5 = 0;
  do {
    if (iVar1 <= iVar2) {
      if (p->vCounts->nSize != p->vHash->vObjs->nSize / 4) {
        __assert_fail("Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                      ,699,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      if (p->vDiv2Nod->nSize != iVar6 + 1) {
        __assert_fail("Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                      ,700,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      Hash_IntManStop(p_01);
      Vec_IntFree(p_02);
      iVar1 = p_00->nSize;
      iVar2 = 0;
      if (iVar1 < 1) {
        iVar1 = 0;
        iVar2 = 0;
      }
      for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
        iVar19 = Vec_IntEntry(p_00,iVar2);
        if (iVar19 < 0) {
          local_80 = -iVar19;
        }
        else {
          iVar19 = Vec_IntEntry(pVVar16,iVar19);
          if (iVar19 != -1) {
            piVar11 = Dam_DivSet(p,iVar19);
            iVar19 = *piVar11;
            *piVar11 = iVar19 + 1;
            piVar11[(long)iVar19 + 1] = local_80;
          }
        }
      }
      Vec_IntFree(pVVar16);
      Vec_IntFree(p_00);
      pVVar16 = Vec_IntStart(iVar18);
      p->vDivLevR = pVVar16;
      if (fVerbose == 0) {
        return;
      }
      printf("Pairs:");
      uVar10 = 1;
      if (1 < (int)uVar7) {
        uVar10 = uVar7;
      }
      dVar23 = (double)(int)uVar10;
      printf("  Total =%9d (%6.2f %%)",((double)(int)uVar7 * 100.0) / dVar23);
      printf("  Tried =%9d (%6.2f %%)",((double)local_60 * 100.0) / dVar23);
      printf("  Used =%9d (%6.2f %%)",((double)(int)uVar22 * 100.0) / dVar23,(ulong)uVar22);
      printf("  Xor =%9d (%6.2f %%)",((double)(int)uVar5 * 100.0) / dVar23,(ulong)uVar5);
      putchar(10);
      printf("Div:  ");
      uVar7 = 1;
      if (1 < (int)uVar17) {
        uVar7 = uVar17;
      }
      dVar23 = (double)(int)uVar7;
      printf("  Total =%9d (%6.2f %%)",(ulong)uVar17);
      printf("  Tried =%9d (%6.2f %%)",((double)(int)uVar17 * 100.0) / dVar23,(ulong)uVar17);
      printf("  Used =%9d (%6.2f %%)",((double)iVar6 * 100.0) / dVar23);
      printf("  Xor =%9d (%6.2f %%)",((double)local_5c * 100.0) / dVar23);
      putchar(10);
      return;
    }
    iVar19 = Hash_IntObjData2(p_01,iVar2);
    iVar3 = (int)uVar21;
    if (1 < iVar19) {
      iVar8 = Hash_IntObjData0(p_01,iVar2);
      iVar9 = Hash_IntObjData1(p_01,iVar2);
      iVar4 = 0;
      if (iVar9 < iVar8) {
        iVar4 = iVar19;
      }
      pHVar12 = p->vHash;
      iVar8 = Hash_IntObjData0(p_01,iVar2);
      iVar9 = Hash_IntObjData1(p_01,iVar2);
      iVar3 = Hash_Int2ManInsert(pHVar12,iVar8,iVar9,iVar3);
      if (iVar3 != p->vHash->vObjs->nSize / 4 + -1) {
        __assert_fail("Num == Hash_IntManEntryNum(p->vHash)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                      ,0x2af,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      pVVar13 = p->vCounts;
      if (iVar3 != pVVar13->nSize) {
        __assert_fail("Num == Vec_FltSize(p->vCounts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                      ,0x2b0,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      iVar8 = Hash_IntObjData0(p_01,iVar2);
      iVar9 = Hash_IntObjData1(p_01,iVar2);
      uVar10 = Vec_IntEntry(p_02,iVar2);
      uVar21 = (ulong)uVar10;
      iVar8 = Dam_ManDivSlack(p,iVar8,iVar9,uVar10);
      Vec_FltPush(pVVar13,(float)iVar8 * 0.005 + (float)iVar19);
      Vec_QuePush(p->vQue,iVar3);
      if (iVar3 != p->vDiv2Nod->nSize) {
        __assert_fail("Num == Vec_IntSize(p->vDiv2Nod)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                      ,0x2b4,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      uVar22 = uVar22 + iVar19;
      uVar5 = uVar5 + iVar4;
      Vec_IntPush(p->vDiv2Nod,p->vNodStore->nSize);
      Vec_IntPush(p->vNodStore,0);
      Vec_IntFillExtra(p->vNodStore,p->vNodStore->nSize + iVar19,-1);
      Vec_IntWriteEntry(pVVar16,iVar2,iVar3);
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void Dam_ManCreatePairs( Dam_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Hash_IntMan_t * vHash;
    Vec_Int_t * vRefsAnd, * vRefsXor, * vSuper, * vDivs, * vRemap, * vLevRMax;
    int i, j, k, Num, FanK, FanJ, nRefs, iNode, iDiv, * pSet;
    int nPairsAll = 0, nPairsTried = 0, nPairsUsed = 0, nPairsXor = 0;
    int nDivsAll = 0, nDivsUsed = 0, nDivsXor = 0;
    Dam_ManCollectSets( p );
    vSuper = p->pGia->vSuper;
    vDivs  = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );
    vHash  = Hash_IntManStart( Gia_ManObjNum(p->pGia)/2 );
    vLevRMax = Vec_IntStart( 1000 );
    Dam_ManCreateMultiRefs( p, &vRefsAnd, &vRefsXor );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Dam_ObjHand(p, i) )
            continue;
        pSet = Dam_ObjSet(p, i);
        nPairsAll += pSet[0] * (pSet[0] - 1) / 2;
        Vec_IntClear(vSuper);
        if ( Gia_ObjIsXor(pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsXor, Abc_Lit2Var(pSet[k])) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else if ( Gia_ObjIsAndReal(p->pGia, pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsAnd, pSet[k]) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else assert( 0 );
        if ( Vec_IntSize(vSuper) < 2 )
            continue;
        // enumerate pairs
        nPairsTried += Vec_IntSize(vSuper) * (Vec_IntSize(vSuper) - 1) / 2;
        Vec_IntPush( vDivs, -i ); // remember node
        Vec_IntForEachEntry( vSuper, FanK, k )
        Vec_IntForEachEntryStart( vSuper, FanJ, j, k+1 )
        {
            if ( (FanK > FanJ) ^ Gia_ObjIsXor(pObj) )
                Num = Hash_Int2ManInsert( vHash, FanJ, FanK, 0 );
            else
                Num = Hash_Int2ManInsert( vHash, FanK, FanJ, 0 );
            if ( Hash_Int2ObjInc( vHash, Num ) == 1 )
            {
                nDivsUsed++;
                nDivsXor += Gia_ObjIsXor(pObj);
            }
            Vec_IntPush( vDivs, Num ); // remember devisor
            // update reverse level
            if ( Num >= Vec_IntSize(vLevRMax) )
                Vec_IntFillExtra( vLevRMax, 3 * Vec_IntSize(vLevRMax) / 2, 0 );
            Vec_IntUpdateEntry( vLevRMax, Num, Vec_IntEntry(p->vNodLevR, i) );
        }
    }
    Vec_IntFree( vRefsAnd );
    Vec_IntFree( vRefsXor );
//    Hash_IntManProfile( vHash );
    // remove entries that appear only once
    p->vHash     = Hash_IntManStart( 3 * nDivsUsed /2 );
    p->vCounts   = Vec_FltAlloc( 2 * nDivsUsed );           Vec_FltPush( p->vCounts, ABC_INFINITY );
    p->vQue      = Vec_QueAlloc( Vec_FltCap(p->vCounts) );
    Vec_QueSetPriority( p->vQue, Vec_FltArrayP(p->vCounts) );
    // mapping div to node
    p->vDiv2Nod  = Vec_IntAlloc( 2 * nDivsUsed );           Vec_IntPush( p->vDiv2Nod, ABC_INFINITY );
    p->vNodStore = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );  Vec_IntPush( p->vNodStore, -1 );
    nDivsAll     = Hash_IntManEntryNum(vHash);
    vRemap       = Vec_IntStartFull( nDivsAll+1 );
    for ( i = 1; i <= nDivsAll; i++ )
    {
        nRefs = Hash_IntObjData2(vHash, i);
        if ( nRefs < 2 )
            continue;
        nPairsUsed += nRefs;
        if ( Hash_IntObjData0(vHash, i) > Hash_IntObjData1(vHash, i) )
            nPairsXor += nRefs; 
        Num = Hash_Int2ManInsert( p->vHash, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), 0 );
        assert( Num == Hash_IntManEntryNum(p->vHash) );
        assert( Num == Vec_FltSize(p->vCounts) );
        Vec_FltPush( p->vCounts, nRefs + 0.005*Dam_ManDivSlack(p, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), Vec_IntEntry(vLevRMax, i)) );
        Vec_QuePush( p->vQue, Num );
        // remember divisors
        assert( Num == Vec_IntSize(p->vDiv2Nod) );
        Vec_IntPush( p->vDiv2Nod, Vec_IntSize(p->vNodStore) );
        Vec_IntPush( p->vNodStore, 0 );
        Vec_IntFillExtra( p->vNodStore, Vec_IntSize(p->vNodStore) + nRefs, -1 );
        // remember entry
        Vec_IntWriteEntry( vRemap, i, Num );
    }
    assert( Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1 );
    assert( Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1 );
    Hash_IntManStop( vHash );
    Vec_IntFree( vLevRMax );
    // fill in the divisors
    iNode = -1;
    Vec_IntForEachEntry( vDivs, iDiv, i )
    {
        if ( iDiv < 0 )
        {
            iNode = -iDiv;
            continue;
        }
        Num = Vec_IntEntry( vRemap, iDiv );
        if ( Num == -1 )
            continue;
        pSet = Dam_DivSet( p, Num );
        pSet[++pSet[0]] = iNode;
    }
    Vec_IntFree( vRemap );
    Vec_IntFree( vDivs );
    // create storage for reverse level of divisor during update
    p->vDivLevR = Vec_IntStart( 2 * nDivsUsed );
    // make sure divisors are added correctly
//    for ( i = 1; i <= nDivsUsed; i++ )
//        assert( Dam_DivSet(p, i)[0] == Vec_FltEntry(p->vCounts, i)+1 );
    if ( !fVerbose )
        return;
    // print stats
    printf( "Pairs:" );
    printf( "  Total =%9d (%6.2f %%)", nPairsAll,   100.0 * nPairsAll   / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nPairsTried, 100.0 * nPairsTried / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nPairsUsed,  100.0 * nPairsUsed  / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nPairsXor,   100.0 * nPairsXor   / Abc_MaxInt(nPairsAll, 1) );
    printf( "\n" );
    printf( "Div:  " );
    printf( "  Total =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nDivsUsed,   100.0 * nDivsUsed   / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nDivsXor,    100.0 * nDivsXor    / Abc_MaxInt(nDivsAll, 1) );
    printf( "\n" );
}